

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ParameterDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParameterDeclarationSyntax,slang::syntax::ParameterDeclarationSyntax_const&>
          (BumpAllocator *this,ParameterDeclarationSyntax *args)

{
  ParameterDeclarationSyntax *pPVar1;
  ParameterDeclarationSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pPVar1 = (ParameterDeclarationSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ParameterDeclarationSyntax::ParameterDeclarationSyntax(in_RSI,pPVar1);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }